

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq.c
# Opt level: O2

int aq_add_frame(aq_t *q,mp3_frame_t *frame)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  unsigned_long uVar4;
  dlist_s *pdVar5;
  void *__ptr;
  dlist_t *pdVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uchar *__dest;
  adu_t aStack_5e88;
  
  if (q == (aq_t *)0x0) {
    __assert_fail("q != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                  0x133,"int aq_add_frame(aq_t *, mp3_frame_t *)");
  }
  if (frame == (mp3_frame_t *)0x0) {
    __assert_fail("frame != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x134,
                  "int aq_add_frame(aq_t *, mp3_frame_t *)");
  }
  uVar1 = (frame->si).main_data_end;
  if (frame->frame_data_size + (long)(int)uVar1 < frame->adu_size) {
    fwrite("Broken frame, skipping...\n",0x1a,1,_stderr);
    iVar9 = 0;
  }
  else {
    uVar4 = q->size;
    aq_enqueue_frame(q,frame);
    iVar9 = 0;
    if (((int)uVar1 <= (int)uVar4) && (frame->adu_size <= q->size)) {
      pdVar5 = aq_tail_frame(q);
      if (pdVar5 == (dlist_t *)0x0) {
        __assert_fail("dlist != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0xf5,
                      "void aq_make_adu(aq_t *)");
      }
      pvVar2 = pdVar5->data;
      if (pvVar2 == (void *)0x0) {
        __assert_fail("tail != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0xf7,
                      "void aq_make_adu(aq_t *)");
      }
      uVar1 = *(uint *)((long)pvVar2 + 0x10);
      memcpy(&aStack_5e88,pvVar2,0x5e60);
      lVar10 = 0;
      do {
        uVar8 = uVar1;
        if (uVar8 == 0) goto LAB_00102280;
        pdVar5 = pdVar5->prev;
        if (pdVar5 == (dlist_t *)0x0) {
          __assert_fail("dlist != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x102,
                        "void aq_make_adu(aq_t *)");
        }
        if (pdVar5->data == (void *)0x0) {
          __assert_fail("prev_frame != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x104,
                        "void aq_make_adu(aq_t *)");
        }
        uVar3 = *(ulong *)((long)pdVar5->data + 0x4eb0);
        iVar9 = (int)uVar3;
        uVar1 = uVar8 - iVar9;
      } while (uVar3 < uVar8);
      lVar10 = (long)(int)(iVar9 - uVar8);
LAB_00102280:
      while( true ) {
        pdVar6 = aq_top_frame(q);
        if (pdVar6 == pdVar5) break;
        pdVar6 = (q->frames).dlist;
        if (pdVar6 == (dlist_t *)0x0) {
          __assert_fail("q->frames.dlist != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x9f,
                        "void aq_discard_top_frame(aq_t *)");
        }
        __ptr = dlist_get(&q->frames,pdVar6);
        if (__ptr == (void *)0x0) {
          __assert_fail("frame != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0xa1,
                        "void aq_discard_top_frame(aq_t *)");
        }
        q->size = q->size - *(long *)((long)__ptr + 0x4eb0);
        free(__ptr);
      }
      __dest = aStack_5e88.raw +
               aStack_5e88.si_size + (ulong)(aStack_5e88.protected == '\0') * 2 + 4;
      for (iVar9 = *(int *)((long)pvVar2 + 0x4e80); 0 < iVar9; iVar9 = iVar9 - iVar7) {
        if (pdVar5 == (dlist_t *)0x0) {
          __assert_fail("dlist != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x116,
                        "void aq_make_adu(aq_t *)");
        }
        pvVar2 = pdVar5->data;
        if (pvVar2 == (void *)0x0) {
          __assert_fail("f != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x118,
                        "void aq_make_adu(aq_t *)");
        }
        iVar7 = *(int *)((long)pvVar2 + 0x4eb0) - (int)lVar10;
        if (iVar9 < iVar7) {
          iVar7 = iVar9;
        }
        memcpy(__dest,(void *)((long)pvVar2 +
                              lVar10 + *(long *)((long)pvVar2 + 0x4e68) +
                                       (ulong)(*(char *)((long)pvVar2 + 2) == '\0') * 2 + 0x4ec4),
               (long)iVar7);
        __dest = __dest + iVar7;
        pdVar5 = pdVar5->next;
        lVar10 = 0;
      }
      aq_enqueue_adu(q,&aStack_5e88);
      iVar9 = 1;
    }
  }
  return iVar9;
}

Assistant:

int aq_add_frame(aq_t *q, mp3_frame_t *frame) {
  assert(q != NULL);
  assert(frame != NULL);

  int back_ptr    = frame->si.main_data_end;
  int size_before = q->size;

  /* discard broken frames */
  if (frame->adu_size > (frame->frame_data_size + back_ptr)) {
    fprintf(stderr, "Broken frame, skipping...\n");
    return 0;
  }

  assert(frame->adu_size <= (frame->frame_data_size + back_ptr));
  
  aq_enqueue_frame(q, frame);

  if ((size_before < back_ptr) ||
      (q->size < frame->adu_size))
    return 0;

  aq_make_adu(q);
  return 1;
}